

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inputs.cpp
# Opt level: O2

void __thiscall helics::Input::handleCallback(Input *this,Time time)

{
  variant<std::function<void_(const_double_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::vector<double,_std::allocator<double>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9,_long>_>_&,_TimeRepresentation<count_time<9,_long>_>)>_>
  *__v;
  bool bVar1;
  variant_alternative_t<0UL,_variant<function<void_(const_double_&,_TimeRepresentation<count_time<9,_long>_>)>,_function<void_(const_long_&,_TimeRepresentation<count_time<9,_long>_>)>,_function<void_(const_basic_string<char,_char_traits<char>,_allocator<char>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_function<void_(const_complex<double>_&,_TimeRepresentation<count_time<9,_long>_>)>,_function<void_(const_vector<double,_allocator<double>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_function<void_(const_vector<complex<double>,_allocator<complex<double>_>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_function<void_(const_NamedPoint_&,_TimeRepresentation<count_time<9,_long>_>)>,_function<void_(const_bool_&,_TimeRepresentation<count_time<9,_long>_>)>,_function<void_(const_TimeRepresentation<count_time<9,_long>_>_&,_TimeRepresentation<count_time<9,_long>_>)>_>_>
  *this_00;
  variant_alternative_t<2UL,_variant<function<void_(const_double_&,_TimeRepresentation<count_time<9,_long>_>)>,_function<void_(const_long_&,_TimeRepresentation<count_time<9,_long>_>)>,_function<void_(const_basic_string<char,_char_traits<char>,_allocator<char>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_function<void_(const_complex<double>_&,_TimeRepresentation<count_time<9,_long>_>)>,_function<void_(const_vector<double,_allocator<double>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_function<void_(const_vector<complex<double>,_allocator<complex<double>_>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_function<void_(const_NamedPoint_&,_TimeRepresentation<count_time<9,_long>_>)>,_function<void_(const_bool_&,_TimeRepresentation<count_time<9,_long>_>)>,_function<void_(const_TimeRepresentation<count_time<9,_long>_>_&,_TimeRepresentation<count_time<9,_long>_>)>_>_>
  *this_01;
  variant_alternative_t<6UL,_variant<function<void_(const_double_&,_TimeRepresentation<count_time<9,_long>_>)>,_function<void_(const_long_&,_TimeRepresentation<count_time<9,_long>_>)>,_function<void_(const_basic_string<char,_char_traits<char>,_allocator<char>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_function<void_(const_complex<double>_&,_TimeRepresentation<count_time<9,_long>_>)>,_function<void_(const_vector<double,_allocator<double>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_function<void_(const_vector<complex<double>,_allocator<complex<double>_>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_function<void_(const_NamedPoint_&,_TimeRepresentation<count_time<9,_long>_>)>,_function<void_(const_bool_&,_TimeRepresentation<count_time<9,_long>_>)>,_function<void_(const_TimeRepresentation<count_time<9,_long>_>_&,_TimeRepresentation<count_time<9,_long>_>)>_>_>
  *this_02;
  variant_alternative_t<1UL,_variant<function<void_(const_double_&,_TimeRepresentation<count_time<9,_long>_>)>,_function<void_(const_long_&,_TimeRepresentation<count_time<9,_long>_>)>,_function<void_(const_basic_string<char,_char_traits<char>,_allocator<char>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_function<void_(const_complex<double>_&,_TimeRepresentation<count_time<9,_long>_>)>,_function<void_(const_vector<double,_allocator<double>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_function<void_(const_vector<complex<double>,_allocator<complex<double>_>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_function<void_(const_NamedPoint_&,_TimeRepresentation<count_time<9,_long>_>)>,_function<void_(const_bool_&,_TimeRepresentation<count_time<9,_long>_>)>,_function<void_(const_TimeRepresentation<count_time<9,_long>_>_&,_TimeRepresentation<count_time<9,_long>_>)>_>_>
  *this_03;
  variant_alternative_t<7UL,_variant<function<void_(const_double_&,_TimeRepresentation<count_time<9,_long>_>)>,_function<void_(const_long_&,_TimeRepresentation<count_time<9,_long>_>)>,_function<void_(const_basic_string<char,_char_traits<char>,_allocator<char>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_function<void_(const_complex<double>_&,_TimeRepresentation<count_time<9,_long>_>)>,_function<void_(const_vector<double,_allocator<double>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_function<void_(const_vector<complex<double>,_allocator<complex<double>_>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_function<void_(const_NamedPoint_&,_TimeRepresentation<count_time<9,_long>_>)>,_function<void_(const_bool_&,_TimeRepresentation<count_time<9,_long>_>)>,_function<void_(const_TimeRepresentation<count_time<9,_long>_>_&,_TimeRepresentation<count_time<9,_long>_>)>_>_>
  *this_04;
  variant_alternative_t<8UL,_variant<function<void_(const_double_&,_TimeRepresentation<count_time<9,_long>_>)>,_function<void_(const_long_&,_TimeRepresentation<count_time<9,_long>_>)>,_function<void_(const_basic_string<char,_char_traits<char>,_allocator<char>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_function<void_(const_complex<double>_&,_TimeRepresentation<count_time<9,_long>_>)>,_function<void_(const_vector<double,_allocator<double>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_function<void_(const_vector<complex<double>,_allocator<complex<double>_>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_function<void_(const_NamedPoint_&,_TimeRepresentation<count_time<9,_long>_>)>,_function<void_(const_bool_&,_TimeRepresentation<count_time<9,_long>_>)>,_function<void_(const_TimeRepresentation<count_time<9,_long>_>_&,_TimeRepresentation<count_time<9,_long>_>)>_>_>
  *this_05;
  variant_alternative_t<3UL,_variant<function<void_(const_double_&,_TimeRepresentation<count_time<9,_long>_>)>,_function<void_(const_long_&,_TimeRepresentation<count_time<9,_long>_>)>,_function<void_(const_basic_string<char,_char_traits<char>,_allocator<char>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_function<void_(const_complex<double>_&,_TimeRepresentation<count_time<9,_long>_>)>,_function<void_(const_vector<double,_allocator<double>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_function<void_(const_vector<complex<double>,_allocator<complex<double>_>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_function<void_(const_NamedPoint_&,_TimeRepresentation<count_time<9,_long>_>)>,_function<void_(const_bool_&,_TimeRepresentation<count_time<9,_long>_>)>,_function<void_(const_TimeRepresentation<count_time<9,_long>_>_&,_TimeRepresentation<count_time<9,_long>_>)>_>_>
  *this_06;
  variant_alternative_t<4UL,_variant<function<void_(const_double_&,_TimeRepresentation<count_time<9,_long>_>)>,_function<void_(const_long_&,_TimeRepresentation<count_time<9,_long>_>)>,_function<void_(const_basic_string<char,_char_traits<char>,_allocator<char>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_function<void_(const_complex<double>_&,_TimeRepresentation<count_time<9,_long>_>)>,_function<void_(const_vector<double,_allocator<double>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_function<void_(const_vector<complex<double>,_allocator<complex<double>_>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_function<void_(const_NamedPoint_&,_TimeRepresentation<count_time<9,_long>_>)>,_function<void_(const_bool_&,_TimeRepresentation<count_time<9,_long>_>)>,_function<void_(const_TimeRepresentation<count_time<9,_long>_>_&,_TimeRepresentation<count_time<9,_long>_>)>_>_>
  *this_07;
  variant_alternative_t<5UL,_variant<function<void_(const_double_&,_TimeRepresentation<count_time<9,_long>_>)>,_function<void_(const_long_&,_TimeRepresentation<count_time<9,_long>_>)>,_function<void_(const_basic_string<char,_char_traits<char>,_allocator<char>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_function<void_(const_complex<double>_&,_TimeRepresentation<count_time<9,_long>_>)>,_function<void_(const_vector<double,_allocator<double>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_function<void_(const_vector<complex<double>,_allocator<complex<double>_>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_function<void_(const_NamedPoint_&,_TimeRepresentation<count_time<9,_long>_>)>,_function<void_(const_bool_&,_TimeRepresentation<count_time<9,_long>_>)>,_function<void_(const_TimeRepresentation<count_time<9,_long>_>_&,_TimeRepresentation<count_time<9,_long>_>)>_>_>
  *this_08;
  double val;
  NamedPoint local_40;
  
  bVar1 = isUpdated(this);
  if (!bVar1) {
    return;
  }
  __v = &this->value_callback;
  switch(*(__index_type *)
          ((long)&(this->value_callback).
                  super__Variant_base<std::function<void_(const_double_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::vector<double,_std::allocator<double>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9,_long>_>_&,_TimeRepresentation<count_time<9,_long>_>)>_>
                  .
                  super__Move_assign_alias<std::function<void_(const_double_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<std::complex<double>_>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9>_>_&,_TimeRepresentation<count_time<9>_>)>_>
                  .
                  super__Copy_assign_alias<std::function<void_(const_double_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<std::complex<double>_>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9>_>_&,_TimeRepresentation<count_time<9>_>)>_>
                  .
                  super__Move_ctor_alias<std::function<void_(const_double_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<std::complex<double>_>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9>_>_&,_TimeRepresentation<count_time<9>_>)>_>
                  .
                  super__Copy_ctor_alias<std::function<void_(const_double_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<std::complex<double>_>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9>_>_&,_TimeRepresentation<count_time<9>_>)>_>
                  .
                  super__Variant_storage_alias<std::function<void_(const_double_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<std::complex<double>_>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9>_>_&,_TimeRepresentation<count_time<9>_>)>_>
          + 0x20)) {
  case '\0':
    local_40.name._M_dataplus._M_p = (pointer)getValue_impl<double>(this);
    this_00 = std::
              get<0ul,std::function<void(double_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(long_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::__cxx11::string_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::complex<double>const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::vector<double,std::allocator<double>>const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::vector<std::complex<double>,std::allocator<std::complex<double>>>const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(helics::NamedPoint_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(bool_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(TimeRepresentation<count_time<9,long>>const&,TimeRepresentation<count_time<9,long>>)>>
                        (__v);
    std::function<void_(const_double_&,_TimeRepresentation<count_time<9,_long>_>)>::operator()
              (this_00,(double *)&local_40,
               (TimeRepresentation<count_time<9,_long>_>)time.internalTimeCode);
    break;
  case '\x01':
    local_40.name._M_dataplus._M_p = (pointer)getValue_impl<long>(this);
    this_03 = std::
              get<1ul,std::function<void(double_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(long_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::__cxx11::string_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::complex<double>const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::vector<double,std::allocator<double>>const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::vector<std::complex<double>,std::allocator<std::complex<double>>>const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(helics::NamedPoint_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(bool_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(TimeRepresentation<count_time<9,long>>const&,TimeRepresentation<count_time<9,long>>)>>
                        (__v);
    std::function<void_(const_long_&,_TimeRepresentation<count_time<9,_long>_>)>::operator()
              (this_03,(long *)&local_40,
               (TimeRepresentation<count_time<9,_long>_>)time.internalTimeCode);
    break;
  default:
    getValue_impl<std::__cxx11::string>(&local_40,this);
    this_01 = std::
              get<2ul,std::function<void(double_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(long_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::__cxx11::string_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::complex<double>const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::vector<double,std::allocator<double>>const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::vector<std::complex<double>,std::allocator<std::complex<double>>>const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(helics::NamedPoint_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(bool_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(TimeRepresentation<count_time<9,long>>const&,TimeRepresentation<count_time<9,long>>)>>
                        (__v);
    CLI::std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_TimeRepresentation<count_time<9,_long>_>)>
    ::operator()((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_TimeRepresentation<count_time<9,_long>_>)>
                  *)this_01,&local_40.name,
                 (TimeRepresentation<count_time<9,_long>_>)time.internalTimeCode);
    goto LAB_001fa27a;
  case '\x03':
    getValue_impl<std::complex<double>>(this);
    this_06 = std::
              get<3ul,std::function<void(double_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(long_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::__cxx11::string_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::complex<double>const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::vector<double,std::allocator<double>>const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::vector<std::complex<double>,std::allocator<std::complex<double>>>const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(helics::NamedPoint_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(bool_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(TimeRepresentation<count_time<9,long>>const&,TimeRepresentation<count_time<9,long>>)>>
                        (__v);
    std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9,_long>_>)>::
    operator()(this_06,(complex<double> *)&local_40,
               (TimeRepresentation<count_time<9,_long>_>)time.internalTimeCode);
    break;
  case '\x04':
    getValue_impl<std::vector<double,std::allocator<double>>>(&local_40,this);
    this_07 = std::
              get<4ul,std::function<void(double_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(long_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::__cxx11::string_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::complex<double>const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::vector<double,std::allocator<double>>const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::vector<std::complex<double>,std::allocator<std::complex<double>>>const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(helics::NamedPoint_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(bool_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(TimeRepresentation<count_time<9,long>>const&,TimeRepresentation<count_time<9,long>>)>>
                        (__v);
    std::
    function<void_(const_std::vector<double,_std::allocator<double>_>_&,_TimeRepresentation<count_time<9,_long>_>)>
    ::operator()(this_07,(vector<double,_std::allocator<double>_> *)&local_40,
                 (TimeRepresentation<count_time<9,_long>_>)time.internalTimeCode);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&local_40);
    break;
  case '\x05':
    getValue_impl<std::vector<std::complex<double>,std::allocator<std::complex<double>>>>
              (&local_40,this);
    this_08 = std::
              get<5ul,std::function<void(double_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(long_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::__cxx11::string_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::complex<double>const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::vector<double,std::allocator<double>>const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::vector<std::complex<double>,std::allocator<std::complex<double>>>const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(helics::NamedPoint_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(bool_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(TimeRepresentation<count_time<9,long>>const&,TimeRepresentation<count_time<9,long>>)>>
                        (__v);
    std::
    function<void_(const_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_&,_TimeRepresentation<count_time<9,_long>_>)>
    ::operator()(this_08,(vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                         &local_40,(TimeRepresentation<count_time<9,_long>_>)time.internalTimeCode);
    std::_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>::~_Vector_base
              ((_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
               &local_40);
    break;
  case '\x06':
    getValue_impl<helics::NamedPoint>(&local_40,this);
    this_02 = std::
              get<6ul,std::function<void(double_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(long_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::__cxx11::string_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::complex<double>const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::vector<double,std::allocator<double>>const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::vector<std::complex<double>,std::allocator<std::complex<double>>>const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(helics::NamedPoint_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(bool_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(TimeRepresentation<count_time<9,long>>const&,TimeRepresentation<count_time<9,long>>)>>
                        (__v);
    std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9,_long>_>)>::
    operator()(this_02,&local_40,(TimeRepresentation<count_time<9,_long>_>)time.internalTimeCode);
LAB_001fa27a:
    std::__cxx11::string::~string((string *)&local_40);
    break;
  case '\a':
    bVar1 = getValue_impl<bool>(this);
    local_40.name._M_dataplus._M_p._0_1_ = bVar1;
    this_04 = std::
              get<7ul,std::function<void(double_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(long_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::__cxx11::string_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::complex<double>const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::vector<double,std::allocator<double>>const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::vector<std::complex<double>,std::allocator<std::complex<double>>>const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(helics::NamedPoint_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(bool_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(TimeRepresentation<count_time<9,long>>const&,TimeRepresentation<count_time<9,long>>)>>
                        (__v);
    std::function<void_(const_bool_&,_TimeRepresentation<count_time<9,_long>_>)>::operator()
              (this_04,(bool *)&local_40,
               (TimeRepresentation<count_time<9,_long>_>)time.internalTimeCode);
    break;
  case '\b':
    local_40.name._M_dataplus._M_p =
         (pointer)getValue_impl<TimeRepresentation<count_time<9,long>>>(this);
    this_05 = std::
              get<8ul,std::function<void(double_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(long_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::__cxx11::string_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::complex<double>const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::vector<double,std::allocator<double>>const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::vector<std::complex<double>,std::allocator<std::complex<double>>>const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(helics::NamedPoint_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(bool_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(TimeRepresentation<count_time<9,long>>const&,TimeRepresentation<count_time<9,long>>)>>
                        (__v);
    std::
    function<void_(const_TimeRepresentation<count_time<9,_long>_>_&,_TimeRepresentation<count_time<9,_long>_>)>
    ::operator()(this_05,(TimeRepresentation<count_time<9,_long>_> *)&local_40,
                 (TimeRepresentation<count_time<9,_long>_>)time.internalTimeCode);
  }
  return;
}

Assistant:

void Input::handleCallback(Time time)
{
    if (!isUpdated()) {
        return;
    }
    switch (value_callback.index()) {
        case double_loc: {
            auto val = getValue<double>();
            std::get<std::function<void(const double&, Time)>>(value_callback)(val, time);
        } break;
        case int_loc: {
            auto val = getValue<int64_t>();
            std::get<std::function<void(const int64_t&, Time)>>(value_callback)(val, time);
        } break;
        case string_loc:
        default: {
            auto val = getValue<std::string>();
            std::get<std::function<void(const std::string&, Time)>>(value_callback)(val, time);
        } break;
        case complex_loc: {
            auto val = getValue<std::complex<double>>();
            std::get<std::function<void(const std::complex<double>&, Time)>>(value_callback)(val,
                                                                                             time);
        } break;
        case vector_loc: {
            auto val = getValue<std::vector<double>>();
            std::get<std::function<void(const std::vector<double>&, Time)>>(value_callback)(val,
                                                                                            time);
        } break;
        case complex_vector_loc: {
            auto val = getValue<std::vector<std::complex<double>>>();
            std::get<std::function<void(const std::vector<std::complex<double>>&, Time)>>(
                value_callback)(val, time);
        } break;
        case named_point_loc: {
            auto val = getValue<NamedPoint>();
            std::get<std::function<void(const NamedPoint&, Time)>>(value_callback)(val, time);
        } break;
        case 7:  // bool loc
        {
            auto val = getValue<bool>();
            std::get<std::function<void(const bool&, Time)>>(value_callback)(val, time);
        } break;
        case 8:  // Time loc
        {
            auto val = getValue<Time>();
            std::get<std::function<void(const Time&, Time)>>(value_callback)(val, time);
        } break;
    }
}